

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimal_cast.cpp
# Opt level: O1

short duckdb::DecimalScaleUpCheckOperator::Operation<duckdb::hugeint_t,short>
                (hugeint_t input,ValidityMask *mask,idx_t idx,void *dataptr)

{
  uint64_t this;
  int64_t iVar1;
  bool bVar2;
  short sVar3;
  InvalidInputException *this_00;
  int64_t iVar4;
  undefined1 strict;
  void *pvVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params_1;
  uint8_t in_R9B;
  hugeint_t value;
  hugeint_t input_00;
  hugeint_t input_01;
  short result;
  string error;
  short local_ba;
  hugeint_t local_b8;
  string local_a8;
  undefined1 *local_88 [2];
  undefined1 local_78 [16];
  string local_68;
  string local_48;
  
  local_b8.upper = input.upper;
  local_b8.lower = input.lower;
  pvVar5 = dataptr;
  bVar2 = hugeint_t::operator>=(&local_b8,(hugeint_t *)((long)dataptr + 0x20));
  strict = SUB81(pvVar5,0);
  if (!bVar2) {
    local_a8._0_16_ = hugeint_t::operator-((hugeint_t *)((long)dataptr + 0x20));
    bVar2 = hugeint_t::operator<=(&local_b8,(hugeint_t *)&local_a8);
    iVar1 = local_b8.upper;
    this = local_b8.lower;
    if (!bVar2) {
      iVar4 = 0;
      input_01.upper = (int64_t)&local_ba;
      input_01.lower = local_b8.upper;
      bVar2 = TryCast::Operation<duckdb::hugeint_t,short>
                        ((TryCast *)local_b8.lower,input_01,(int16_t *)0x0,(bool)strict);
      if (bVar2) {
        return local_ba * *(short *)((long)dataptr + 0x30);
      }
      this_00 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      input_00.upper = iVar4;
      input_00.lower = iVar1;
      CastExceptionText<duckdb::hugeint_t,short>(&local_a8,(duckdb *)this,input_00);
      InvalidInputException::InvalidInputException(this_00,(string *)&local_a8);
      __cxa_throw(this_00,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
    }
  }
  local_88[0] = local_78;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_88,"Casting value \"%s\" to type %s failed: value is out of range!","")
  ;
  params_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             (ulong)*(byte *)((long)dataptr + 0x33);
  value.upper._0_1_ = *(undefined1 *)((long)dataptr + 0x32);
  value.lower = local_b8.upper;
  value.upper._1_7_ = 0;
  Decimal::ToString_abi_cxx11_
            (&local_48,(Decimal *)local_b8.lower,value,*(byte *)((long)dataptr + 0x33),in_R9B);
  LogicalType::ToString_abi_cxx11_(&local_68,(LogicalType *)(*dataptr + 8));
  StringUtil::Format<std::__cxx11::string,std::__cxx11::string>
            (&local_a8,(StringUtil *)local_88,&local_48,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_68,params_1
            );
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  if (local_88[0] != local_78) {
    operator_delete(local_88[0]);
  }
  sVar3 = HandleVectorCastError::Operation<short>
                    (&local_a8,mask,idx,(VectorTryCastData *)((long)dataptr + 8));
  if ((hugeint_t *)local_a8._M_dataplus._M_p != (hugeint_t *)&local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  return sVar3;
}

Assistant:

static RESULT_TYPE Operation(INPUT_TYPE input, ValidityMask &mask, idx_t idx, void *dataptr) {
		auto data = (DecimalScaleInput<INPUT_TYPE, RESULT_TYPE> *)dataptr;
		if (input >= data->limit || input <= -data->limit) {
			auto error = StringUtil::Format("Casting value \"%s\" to type %s failed: value is out of range!",
			                                Decimal::ToString(input, data->source_width, data->source_scale),
			                                data->result.GetType().ToString());
			return HandleVectorCastError::Operation<RESULT_TYPE>(std::move(error), mask, idx, data->vector_cast_data);
		}
		return Cast::Operation<INPUT_TYPE, RESULT_TYPE>(input) * data->factor;
	}